

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::convexSweepTest
          (btCollisionWorld *this,btConvexShape *castShape,btTransform *convexFromWorld,
          btTransform *convexToWorld,ConvexResultCallback *resultCallback,
          btScalar allowedCcdPenetration)

{
  long *plVar1;
  btVector3 *pbVar2;
  btVector3 *pbVar3;
  long in_RDI;
  btQuaternion bVar4;
  btSingleSweepCallback convexCB;
  btTransform R;
  btVector3 zeroLinVel;
  btVector3 angVel;
  btVector3 linVel;
  btVector3 castShapeAabbMax;
  btVector3 castShapeAabbMin;
  btTransform convexToTrans;
  btTransform convexFromTrans;
  CProfileSample __profile;
  btTransform *in_stack_fffffffffffffd78;
  btTransform *in_stack_fffffffffffffd80;
  btTransform *in_stack_fffffffffffffd90;
  undefined1 local_240 [32];
  btVector3 *in_stack_fffffffffffffde0;
  btVector3 *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  btScalar in_stack_fffffffffffffdf4;
  btVector3 *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  btScalar in_stack_fffffffffffffe04;
  btTransform *in_stack_fffffffffffffe08;
  btTransform *in_stack_fffffffffffffe10;
  btScalar in_stack_fffffffffffffe94;
  ConvexResultCallback *resultCallback_00;
  btCollisionWorld *world;
  btTransform *in_stack_fffffffffffffea8;
  btTransform *in_stack_fffffffffffffeb0;
  btConvexShape *in_stack_fffffffffffffeb8;
  btSingleSweepCallback *in_stack_fffffffffffffec0;
  btScalar local_118;
  btScalar local_114;
  btScalar local_110;
  btVector3 local_10c;
  btVector3 local_fc;
  btVector3 local_ec;
  btVector3 local_dc;
  btVector3 local_cc;
  btTransform local_bc;
  btTransform local_70;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  btTransform::btTransform(in_stack_fffffffffffffd80);
  btTransform::btTransform(in_stack_fffffffffffffd80);
  btTransform::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  btTransform::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  btVector3::btVector3(&local_cc);
  btVector3::btVector3(&local_dc);
  btVector3::btVector3(&local_ec);
  btVector3::btVector3(&local_fc);
  btTransformUtil::calculateVelocity
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
             in_stack_fffffffffffffdf8,
             (btVector3 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  btVector3::btVector3(&local_10c);
  local_110 = 0.0;
  local_114 = 0.0;
  local_118 = 0.0;
  btVector3::setValue(&local_10c,&local_110,&local_114,&local_118);
  btTransform::btTransform(in_stack_fffffffffffffd80);
  btTransform::setIdentity(in_stack_fffffffffffffd90);
  bVar4 = btTransform::getRotation(in_stack_fffffffffffffd80);
  world = bVar4.super_btQuadWord.m_floats._8_8_;
  resultCallback_00 = bVar4.super_btQuadWord.m_floats._0_8_;
  btTransform::setRotation(in_stack_fffffffffffffd80,(btQuaternion *)in_stack_fffffffffffffd78);
  btCollisionShape::calculateTemporalAabb
            ((btCollisionShape *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (btVector3 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,
             in_stack_fffffffffffffde0);
  btSingleSweepCallback::btSingleSweepCallback
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8,world,resultCallback_00,in_stack_fffffffffffffe94);
  plVar1 = *(long **)(in_RDI + 0x60);
  pbVar2 = btTransform::getOrigin(&local_70);
  pbVar3 = btTransform::getOrigin(&local_bc);
  (**(code **)(*plVar1 + 0x30))(plVar1,pbVar2,pbVar3,local_240,&local_cc,&local_dc);
  btSingleSweepCallback::~btSingleSweepCallback((btSingleSweepCallback *)0x17cbf9);
  CProfileSample::~CProfileSample((CProfileSample *)0x17cc06);
  return;
}

Assistant:

void	btCollisionWorld::convexSweepTest(const btConvexShape* castShape, const btTransform& convexFromWorld, const btTransform& convexToWorld, ConvexResultCallback& resultCallback, btScalar allowedCcdPenetration) const
{

	BT_PROFILE("convexSweepTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	/// unfortunately the implementation for rayTest and convexSweepTest duplicated, albeit practically identical



	btTransform	convexFromTrans,convexToTrans;
	convexFromTrans = convexFromWorld;
	convexToTrans = convexToWorld;
	btVector3 castShapeAabbMin, castShapeAabbMax;
	/* Compute AABB that encompasses angular movement */
	{
		btVector3 linVel, angVel;
		btTransformUtil::calculateVelocity (convexFromTrans, convexToTrans, 1.0f, linVel, angVel);
		btVector3 zeroLinVel;
		zeroLinVel.setValue(0,0,0);
		btTransform R;
		R.setIdentity ();
		R.setRotation (convexFromTrans.getRotation());
		castShape->calculateTemporalAabb (R, zeroLinVel, angVel, 1.0f, castShapeAabbMin, castShapeAabbMax);
	}

#ifndef USE_BRUTEFORCE_RAYBROADPHASE

	btSingleSweepCallback	convexCB(castShape,convexFromWorld,convexToWorld,this,resultCallback,allowedCcdPenetration);

	m_broadphasePairCache->rayTest(convexFromTrans.getOrigin(),convexToTrans.getOrigin(),convexCB,castShapeAabbMin,castShapeAabbMax);

#else
	/// go over all objects, and if the ray intersects their aabb + cast shape aabb,
	// do a ray-shape query using convexCaster (CCD)
	int i;
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject*	collisionObject= m_collisionObjects[i];
		//only perform raycast if filterMask matches
		if(resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) {
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
			AabbExpand (collisionObjectAabbMin, collisionObjectAabbMax, castShapeAabbMin, castShapeAabbMax);
			btScalar hitLambda = btScalar(1.); //could use resultCallback.m_closestHitFraction, but needs testing
			btVector3 hitNormal;
			if (btRayAabb(convexFromWorld.getOrigin(),convexToWorld.getOrigin(),collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,hitNormal))
			{
				objectQuerySingle(castShape, convexFromTrans,convexToTrans,
					collisionObject,
					collisionObject->getCollisionShape(),
					collisionObject->getWorldTransform(),
					resultCallback,
					allowedCcdPenetration);
			}
		}
	}
#endif //USE_BRUTEFORCE_RAYBROADPHASE
}